

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayCreation.h
# Opt level: O1

Expression * CreateArray(Expression *array_size)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ExpressionList *this;
  BinopExpression *this_00;
  ConstExpression *this_01;
  BinopExpression *this_02;
  ConstExpression *this_03;
  EseqExpression *this_04;
  SeqStatement *this_05;
  MoveStatement *this_06;
  TempExpression *pTVar2;
  CallExpression *this_07;
  NameExpression *this_08;
  MoveStatement *this_09;
  MemExpression *this_10;
  Temporary tmp;
  Temporary local_f0;
  Temporary local_d0;
  string local_b0;
  Temporary local_90;
  Temporary local_70;
  Label local_50;
  
  this = (ExpressionList *)operator_new(0x20);
  (this->super_BaseElement)._vptr_BaseElement = (_func_int **)0x0;
  (this->expressions_).super__Vector_base<IRT::Expression_*,_std::allocator<IRT::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->expressions_).super__Vector_base<IRT::Expression_*,_std::allocator<IRT::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->expressions_).super__Vector_base<IRT::Expression_*,_std::allocator<IRT::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_BaseElement)._vptr_BaseElement = (_func_int **)&PTR__ExpressionList_0016ef38;
  (this->expressions_).super__Vector_base<IRT::Expression_*,_std::allocator<IRT::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->expressions_).super__Vector_base<IRT::Expression_*,_std::allocator<IRT::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->expressions_).super__Vector_base<IRT::Expression_*,_std::allocator<IRT::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = (BinopExpression *)operator_new(0x20);
  this_01 = (ConstExpression *)operator_new(0x10);
  IRT::ConstExpression::ConstExpression(this_01,4);
  this_02 = (BinopExpression *)operator_new(0x20);
  this_03 = (ConstExpression *)operator_new(0x10);
  IRT::ConstExpression::ConstExpression(this_03,1);
  IRT::BinopExpression::BinopExpression(this_02,PLUS,array_size,(Expression *)this_03);
  IRT::BinopExpression::BinopExpression(this_00,MUL,(Expression *)this_01,(Expression *)this_02);
  IRT::ExpressionList::Add(this,(Expression *)this_00);
  IRT::Temporary::Temporary(&local_f0);
  this_04 = (EseqExpression *)operator_new(0x18);
  this_05 = (SeqStatement *)operator_new(0x18);
  this_06 = (MoveStatement *)operator_new(0x18);
  pTVar2 = (TempExpression *)operator_new(0x28);
  local_90.name_._M_dataplus._M_p = (pointer)&local_90.name_.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,local_f0.name_._M_dataplus._M_p,
             local_f0.name_._M_dataplus._M_p + local_f0.name_._M_string_length);
  IRT::TempExpression::TempExpression(pTVar2,&local_90);
  this_07 = (CallExpression *)operator_new(0x18);
  this_08 = (NameExpression *)operator_new(0x28);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"malloc","");
  IRT::Label::Label(&local_50,&local_b0);
  IRT::NameExpression::NameExpression(this_08,&local_50);
  IRT::CallExpression::CallExpression(this_07,(Expression *)this_08,this);
  IRT::MoveStatement::MoveStatement(this_06,(Expression *)pTVar2,(Expression *)this_07);
  this_09 = (MoveStatement *)operator_new(0x18);
  this_10 = (MemExpression *)operator_new(0x10);
  pTVar2 = (TempExpression *)operator_new(0x28);
  local_d0.name_._M_dataplus._M_p = (pointer)&local_d0.name_.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,local_f0.name_._M_dataplus._M_p,
             local_f0.name_._M_dataplus._M_p + local_f0.name_._M_string_length);
  IRT::TempExpression::TempExpression(pTVar2,&local_d0);
  IRT::MemExpression::MemExpression(this_10,(Expression *)pTVar2);
  IRT::MoveStatement::MoveStatement(this_09,(Expression *)this_10,array_size);
  IRT::SeqStatement::SeqStatement(this_05,(Statement *)this_06,(Statement *)this_09);
  pTVar2 = (TempExpression *)operator_new(0x28);
  paVar1 = &local_70.name_.field_2;
  local_70.name_._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,local_f0.name_._M_dataplus._M_p,
             local_f0.name_._M_dataplus._M_p + local_f0.name_._M_string_length);
  IRT::TempExpression::TempExpression(pTVar2,&local_70);
  IRT::EseqExpression::EseqExpression(this_04,(Statement *)this_05,(Expression *)pTVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.name_._M_dataplus._M_p != paVar1) {
    operator_delete(local_70.name_._M_dataplus._M_p,local_70.name_.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.name_._M_dataplus._M_p != &local_d0.name_.field_2) {
    operator_delete(local_d0.name_._M_dataplus._M_p,local_d0.name_.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.label_._M_dataplus._M_p != &local_50.label_.field_2) {
    operator_delete(local_50.label_._M_dataplus._M_p,
                    local_50.label_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.name_._M_dataplus._M_p != &local_90.name_.field_2) {
    operator_delete(local_90.name_._M_dataplus._M_p,local_90.name_.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.name_._M_dataplus._M_p != &local_f0.name_.field_2) {
    operator_delete(local_f0.name_._M_dataplus._M_p,local_f0.name_.field_2._M_allocated_capacity + 1
                   );
  }
  return &this_04->super_Expression;
}

Assistant:

IRT::Expression* CreateArray(IRT::Expression* array_size) {
  auto* irt_expressions = new IRT::ExpressionList();
  irt_expressions->Add(new IRT::BinopExpression(
      IRT::BinaryOperatorType::MUL, new IRT::ConstExpression(COMPILER_WORD_SIZE),
      new IRT::BinopExpression(IRT::BinaryOperatorType::PLUS, array_size,
                               new IRT::ConstExpression(1))));

  IRT::Temporary tmp;
  return new IRT::EseqExpression(
      new IRT::SeqStatement(
          new IRT::MoveStatement(
              new IRT::TempExpression(tmp),
              new IRT::CallExpression(
                  new IRT::NameExpression(IRT::Label("malloc")),
                  irt_expressions)),
          new IRT::MoveStatement(
              new IRT::MemExpression(new IRT::TempExpression(tmp)),
              array_size)),
      new IRT::TempExpression(tmp));
}